

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O3

size_t __thiscall
capnp::_::anon_unknown_0::TestInputStream::tryRead
          (TestInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Fault f;
  Fault local_18;
  
  if (maxBytes <= (ulong)((long)this->end - (long)this->pos)) {
    if (this->lazy != false) {
      maxBytes = minBytes;
    }
    memcpy(buffer,this->pos,maxBytes);
    this->pos = this->pos + maxBytes;
    return maxBytes;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-test.c++"
             ,0xe1,FAILED,"maxBytes <= size_t(end - pos)","\"Overran end of stream.\"",
             (char (*) [23])"Overran end of stream.");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

size_t tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_ASSERT(maxBytes <= size_t(end - pos), "Overran end of stream.");
    size_t amount = lazy ? minBytes : maxBytes;
    memcpy(buffer, pos, amount);
    pos += amount;
    return amount;
  }